

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O1

void __thiscall CVmUndo::undo_to_savept(CVmUndo *this)

{
  CVmUndoMeta *pCVar1;
  CVmUndoMeta *pCVar2;
  byte bVar3;
  CVmUndoMeta *pCVar4;
  CVmUndoMeta **ppCVar5;
  
  if (this->savept_cnt_ == 0) {
    return;
  }
  pCVar4 = this->cur_first_;
  pCVar2 = this->rec_arr_ + this->rec_arr_size_;
  if (this->next_free_ != this->rec_arr_) {
    pCVar2 = this->next_free_;
  }
  pCVar2 = pCVar2 + -1;
  if (pCVar2 != pCVar4) {
    do {
      CVmObjTable::apply_undo(&G_obj_table_X,&pCVar2->rec);
      pCVar1 = this->rec_arr_ + this->rec_arr_size_;
      if (pCVar2 != this->rec_arr_) {
        pCVar1 = pCVar2;
      }
      pCVar4 = this->cur_first_;
      pCVar2 = pCVar1 + -1;
    } while (pCVar2 != pCVar4);
  }
  pCVar4 = (pCVar4->link).prev_first;
  this->cur_first_ = pCVar4;
  ppCVar5 = &(pCVar4->link).next_first;
  if (pCVar4 == (CVmUndoMeta *)0x0) {
    ppCVar5 = &this->oldest_first_;
  }
  *ppCVar5 = (CVmUndoMeta *)0x0;
  this->savept_cnt_ = this->savept_cnt_ - 1;
  bVar3 = this->cur_savept_ - 1;
  this->cur_savept_ = -(bVar3 == 0) | bVar3;
  this->next_free_ = pCVar2;
  CVmObjTable::notify_new_savept(&G_obj_table_X);
  return;
}

Assistant:

void CVmUndo::undo_to_savept(VMG0_)
{
    CVmUndoMeta *meta;
    
    /* if we don't have any savepoints, there's nothing to do */
    if (savept_cnt_ == 0)
        return;

    /* 
     *   Starting with the most recently-added record, apply each record
     *   in sequence until we reach the first savepoint in the undo list.  
     */
    meta = next_free_;
    for (;;)
    {
        /* 
         *   move to the previous record, wrapping to the end of the array
         *   at the first record (since we treat the array as circular) 
         */
        if (meta == rec_arr_)
            meta = rec_arr_ + rec_arr_size_;
        --meta;

        /* 
         *   if we're at the first record in the current savepoint, we're
         *   done 
         */
        if (meta == cur_first_)
            break;

        /* apply this undo record */
        G_obj_table->apply_undo(vmg_ &meta->rec);
    }

    /*
     *   Unwind the undo stack -- get the first record in the previous
     *   savepoint from the link pointer. 
     */
    cur_first_ = cur_first_->link.prev_first;

    /* 
     *   there's nothing following the current savepoint any more -- the
     *   savepoint we just applied is gone now 
     */
    if (cur_first_ != 0)
        cur_first_->link.next_first = 0;
    else
        oldest_first_ = 0;

    /* that's one less savepoint */
    --savept_cnt_;

    /* make the previous savepoint current */
    --cur_savept_;
    if (cur_savept_ == 0)
        cur_savept_ = VM_SAVEPT_MAX;

    /* the savepoint link we just removed is now the next free record */
    next_free_ = meta;

    /* 
     *   notify objects that a new savepoint is in effect - the savepoint
     *   isn't new in the sense of being newly created, but in the sense of
     *   being a different savepoint than was previously in effect 
     */
    G_obj_table->notify_new_savept();
}